

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_motion_facade.c
# Opt level: O0

int gm_get_params_cost(WarpedMotionParams *gm,WarpedMotionParams *ref_gm,int allow_hp)

{
  char cVar1;
  int16_t v;
  int iVar2;
  int iVar3;
  sbyte sVar4;
  int in_EDX;
  int *in_RSI;
  long in_RDI;
  int trans_prec_diff;
  int trans_bits;
  int params_cost;
  int16_t in_stack_ffffffffffffffd0;
  int16_t in_stack_ffffffffffffffd2;
  undefined4 in_stack_ffffffffffffffd4;
  int local_18;
  
  local_18 = 0;
  cVar1 = *(char *)(in_RDI + 0x20);
  if (cVar1 != '\0') {
    if (cVar1 != '\x01') {
      if (cVar1 != '\x02' && cVar1 != '\x03') goto LAB_0024f3fa;
      iVar2 = aom_count_signed_primitive_refsubexpfin
                        ((uint16_t)((uint)in_stack_ffffffffffffffd4 >> 0x10),
                         (uint16_t)in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd2,
                         in_stack_ffffffffffffffd0);
      local_18 = aom_count_signed_primitive_refsubexpfin
                           ((uint16_t)((uint)in_stack_ffffffffffffffd4 >> 0x10),
                            (uint16_t)in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd2,
                            in_stack_ffffffffffffffd0);
      local_18 = local_18 + iVar2;
      if (2 < *(byte *)(in_RDI + 0x20)) {
        iVar2 = aom_count_signed_primitive_refsubexpfin
                          ((uint16_t)((uint)in_stack_ffffffffffffffd4 >> 0x10),
                           (uint16_t)in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd2,
                           in_stack_ffffffffffffffd0);
        iVar3 = aom_count_signed_primitive_refsubexpfin
                          ((uint16_t)((uint)in_stack_ffffffffffffffd4 >> 0x10),
                           (uint16_t)in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd2,
                           in_stack_ffffffffffffffd0);
        local_18 = iVar3 + iVar2 + local_18;
      }
    }
    if (*(char *)(in_RDI + 0x20) == '\x01') {
      iVar2 = ((in_EDX != 0 ^ 0xffU) & 1) + 0xd;
    }
    else {
      iVar2 = 10;
    }
    sVar4 = (sbyte)iVar2;
    v = (int16_t)(*in_RSI >> sVar4);
    iVar3 = aom_count_signed_primitive_refsubexpfin(0,(uint16_t)iVar2,in_stack_ffffffffffffffd2,v);
    iVar2 = aom_count_signed_primitive_refsubexpfin
                      ((uint16_t)((uint)iVar2 >> 0x10),(uint16_t)iVar2,(int16_t)(in_RSI[1] >> sVar4)
                       ,v);
    local_18 = iVar2 + iVar3 + local_18;
  }
LAB_0024f3fa:
  return local_18 << 9;
}

Assistant:

static int gm_get_params_cost(const WarpedMotionParams *gm,
                              const WarpedMotionParams *ref_gm, int allow_hp) {
  int params_cost = 0;
  int trans_bits, trans_prec_diff;
  switch (gm->wmtype) {
    case AFFINE:
    case ROTZOOM:
      params_cost += aom_count_signed_primitive_refsubexpfin(
          GM_ALPHA_MAX + 1, SUBEXPFIN_K,
          (ref_gm->wmmat[2] >> GM_ALPHA_PREC_DIFF) - (1 << GM_ALPHA_PREC_BITS),
          (gm->wmmat[2] >> GM_ALPHA_PREC_DIFF) - (1 << GM_ALPHA_PREC_BITS));
      params_cost += aom_count_signed_primitive_refsubexpfin(
          GM_ALPHA_MAX + 1, SUBEXPFIN_K,
          (ref_gm->wmmat[3] >> GM_ALPHA_PREC_DIFF),
          (gm->wmmat[3] >> GM_ALPHA_PREC_DIFF));
      if (gm->wmtype >= AFFINE) {
        params_cost += aom_count_signed_primitive_refsubexpfin(
            GM_ALPHA_MAX + 1, SUBEXPFIN_K,
            (ref_gm->wmmat[4] >> GM_ALPHA_PREC_DIFF),
            (gm->wmmat[4] >> GM_ALPHA_PREC_DIFF));
        params_cost += aom_count_signed_primitive_refsubexpfin(
            GM_ALPHA_MAX + 1, SUBEXPFIN_K,
            (ref_gm->wmmat[5] >> GM_ALPHA_PREC_DIFF) -
                (1 << GM_ALPHA_PREC_BITS),
            (gm->wmmat[5] >> GM_ALPHA_PREC_DIFF) - (1 << GM_ALPHA_PREC_BITS));
      }
      AOM_FALLTHROUGH_INTENDED;
    case TRANSLATION:
      trans_bits = (gm->wmtype == TRANSLATION)
                       ? GM_ABS_TRANS_ONLY_BITS - !allow_hp
                       : GM_ABS_TRANS_BITS;
      trans_prec_diff = (gm->wmtype == TRANSLATION)
                            ? GM_TRANS_ONLY_PREC_DIFF + !allow_hp
                            : GM_TRANS_PREC_DIFF;
      params_cost += aom_count_signed_primitive_refsubexpfin(
          (1 << trans_bits) + 1, SUBEXPFIN_K,
          (ref_gm->wmmat[0] >> trans_prec_diff),
          (gm->wmmat[0] >> trans_prec_diff));
      params_cost += aom_count_signed_primitive_refsubexpfin(
          (1 << trans_bits) + 1, SUBEXPFIN_K,
          (ref_gm->wmmat[1] >> trans_prec_diff),
          (gm->wmmat[1] >> trans_prec_diff));
      AOM_FALLTHROUGH_INTENDED;
    case IDENTITY: break;
    default: assert(0);
  }
  return (params_cost << AV1_PROB_COST_SHIFT);
}